

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  int32_t k;
  int iVar6;
  int32_t iVar7;
  int *piVar8;
  long lVar9;
  ostream *poVar10;
  pointer pbVar11;
  int iVar12;
  ulong uVar13;
  real threshold;
  double dVar14;
  shared_ptr<const_fasttext::Dictionary> dict;
  FastText fasttext;
  ifstream ifs;
  Dictionary *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  FastText local_338;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  size_type local_278;
  __node_base _Stack_270;
  size_type local_268;
  float fStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [16];
  bool local_248;
  string local_238 [16];
  
  iVar5 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1));
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (((long)uVar13 >> 5) - 7U < 0xfffffffffffffffd) {
    if (iVar5 == 0) {
      printTestLabelUsage();
      goto LAB_001077cc;
    }
LAB_001077c7:
    printTestUsage();
    goto LAB_001077cc;
  }
  k = 1;
  pbVar11 = pbVar2;
  if (4 < (ulong)((long)uVar13 >> 5)) {
    pcVar3 = pbVar2[4]._M_dataplus._M_p;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(pcVar3,(char **)local_238,10);
    if (local_238[0]._M_dataplus._M_p == pcVar3) {
      std::__throw_invalid_argument("stoi");
      goto LAB_001077c7;
    }
    iVar12 = *piVar8;
    if ((int)lVar9 != lVar9 || iVar12 == 0x22) {
      lVar9 = std::__throw_out_of_range("stoi");
    }
    k = (int32_t)lVar9;
    if (iVar12 == 0) {
      *piVar8 = iVar6;
    }
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  }
  threshold = 0.0;
  if (0xa0 < uVar13) {
    pcVar3 = pbVar11[5]._M_dataplus._M_p;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    threshold = strtof(pcVar3,(char **)local_238);
    if (local_238[0]._M_dataplus._M_p == pcVar3) {
      std::__throw_invalid_argument("stof");
    }
    if (*piVar8 != 0) {
      if (*piVar8 != 0x22) goto LAB_00107881;
      std::__throw_out_of_range("stof");
    }
    *piVar8 = iVar6;
  }
LAB_00107881:
  ::fasttext::FastText::FastText(&local_338);
  ::fasttext::FastText::loadModel(&local_338,pbVar2 + 2);
  uStack_25c = 0;
  local_298 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_288._8_8_ = 0;
  local_288._0_8_ = local_258 + 8;
  local_288 = local_288 << 0x40;
  local_278 = 1;
  _Stack_270._M_nxt = (_Hash_node_base *)0x0;
  local_268 = 0;
  fStack_260 = 1.0;
  local_258 = (undefined1  [16])0x0;
  local_248 = false;
  iVar6 = std::__cxx11::string::compare((char *)(pbVar2 + 3));
  if (iVar6 == 0) {
    ::fasttext::FastText::test(&local_338,(istream *)&std::cin,k,threshold,(Meter *)local_2b8);
  }
  else {
    std::ifstream::ifstream(local_238,(string *)(pbVar2 + 3),_S_in);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Test file cannot be opened!",0x1b);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_001077cc:
      exit(1);
    }
    ::fasttext::FastText::test(&local_338,(istream *)local_238,k,threshold,(Meter *)local_2b8);
    std::ifstream::~ifstream(local_238);
  }
  lVar9 = std::cout;
  if (iVar5 == 0) {
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar9 + -0x18)) = 6;
    ::fasttext::FastText::getDictionary(&local_338);
    paVar1 = &local_238[0].field_2;
    iVar5 = 0;
    while( true ) {
      iVar7 = ::fasttext::Dictionary::nlabels(local_348);
      if (iVar7 <= iVar5) break;
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"F1-Score","");
      dVar14 = ::fasttext::Meter::f1Score((Meter *)local_2b8,iVar5);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
      if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar14);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Precision","");
      dVar14 = ::fasttext::Meter::precision((Meter *)local_2b8,iVar5);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
      if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar14);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Recall","");
      dVar14 = ::fasttext::Meter::recall((Meter *)local_2b8,iVar5);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
      if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
        std::ostream::_M_insert<double>(dVar14);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      ::fasttext::Dictionary::getLabel_abi_cxx11_(local_238,local_348,iVar5);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238[0]._M_dataplus._M_p,
                           local_238[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      iVar5 = iVar5 + 1;
    }
    if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
    }
  }
  ::fasttext::Meter::writeGeneralMetrics((Meter *)local_2b8,(ostream *)&std::cout,k);
  exit(0);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter(false);

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}